

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O1

void __thiscall wasm::BinaryInstWriter::visitSIMDExtract(BinaryInstWriter *this,SIMDExtract *curr)

{
  void *__buf;
  int __fd;
  LEB<unsigned_int,_unsigned_char> local_1c;
  
  local_1c.value._0_1_ = 0xfd;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
             (uchar *)&local_1c);
  switch(curr->op) {
  case ExtractLaneSVecI8x16:
    __fd = (int)this->o;
    local_1c.value = 0x15;
    break;
  case ExtractLaneUVecI8x16:
    __fd = (int)this->o;
    local_1c.value = 0x16;
    break;
  case ExtractLaneSVecI16x8:
    __fd = (int)this->o;
    local_1c.value = 0x18;
    break;
  case ExtractLaneUVecI16x8:
    __fd = (int)this->o;
    local_1c.value = 0x19;
    break;
  case ExtractLaneVecI32x4:
    __fd = (int)this->o;
    local_1c.value = 0x1b;
    break;
  case ExtractLaneVecI64x2:
    __fd = (int)this->o;
    local_1c.value = 0x1d;
    break;
  case ExtractLaneVecF16x8:
    __fd = (int)this->o;
    local_1c.value = 0x121;
    break;
  case ExtractLaneVecF32x4:
    __fd = (int)this->o;
    local_1c.value = 0x1f;
    break;
  case ExtractLaneVecF64x2:
    __fd = (int)this->o;
    local_1c.value = 0x21;
    break;
  default:
    goto switchD_00cab45c_default;
  }
  LEB<unsigned_int,_unsigned_char>::write(&local_1c,__fd,__buf,0xe534c8);
switchD_00cab45c_default:
  local_1c.value._0_1_ = curr->index;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
             (uchar *)&local_1c);
  return;
}

Assistant:

void BinaryInstWriter::visitSIMDExtract(SIMDExtract* curr) {
  o << int8_t(BinaryConsts::SIMDPrefix);
  switch (curr->op) {
    case ExtractLaneSVecI8x16:
      o << U32LEB(BinaryConsts::I8x16ExtractLaneS);
      break;
    case ExtractLaneUVecI8x16:
      o << U32LEB(BinaryConsts::I8x16ExtractLaneU);
      break;
    case ExtractLaneSVecI16x8:
      o << U32LEB(BinaryConsts::I16x8ExtractLaneS);
      break;
    case ExtractLaneUVecI16x8:
      o << U32LEB(BinaryConsts::I16x8ExtractLaneU);
      break;
    case ExtractLaneVecI32x4:
      o << U32LEB(BinaryConsts::I32x4ExtractLane);
      break;
    case ExtractLaneVecI64x2:
      o << U32LEB(BinaryConsts::I64x2ExtractLane);
      break;
    case ExtractLaneVecF16x8:
      o << U32LEB(BinaryConsts::F16x8ExtractLane);
      break;
    case ExtractLaneVecF32x4:
      o << U32LEB(BinaryConsts::F32x4ExtractLane);
      break;
    case ExtractLaneVecF64x2:
      o << U32LEB(BinaryConsts::F64x2ExtractLane);
      break;
  }
  o << uint8_t(curr->index);
}